

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O3

MPP_RET camera_source_put_frame(CamSource *ctx,RK_S32 idx)

{
  RK_S32 RVar1;
  v4l2_buffer buf;
  v4l2_plane planes [1];
  RK_S32 local_a0;
  v4l2_buf_type local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined1 *puStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined1 local_48 [72];
  
  if (-1 < idx) {
    local_9c = ctx->type;
    puStack_60 = (undefined1 *)0x0;
    uStack_50 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_68 = 0x100000000;
    if (local_9c == V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE) {
      puStack_60 = local_48;
    }
    local_58 = (ulong)(local_9c == V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE);
    local_a0 = idx;
    RVar1 = camera_source_ioctl(ctx->fd,-0x3fa7a9f1,&local_a0);
    if (RVar1 == -1) {
      _mpp_log_l(2,"camera_source","VIDIOC_QBUF\n","camera_source_put_frame");
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET camera_source_put_frame(CamSource *ctx, RK_S32 idx)
{
    struct v4l2_buffer buf;
    enum v4l2_buf_type type;

    if (idx < 0)
        return MPP_OK;

    type = ctx->type;
    buf = (struct v4l2_buffer) {0};
    buf.type   = type;
    buf.memory = V4L2_MEMORY_MMAP;
    buf.index  = idx;

    struct v4l2_plane planes[FMT_NUM_PLANES];
    if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == type) {
        buf.m.planes = planes;
        buf.length = FMT_NUM_PLANES;
    }

    // Tell kernel it's ok to overwrite this frame
    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_QBUF, &buf)) {
        mpp_err_f("VIDIOC_QBUF\n");
        return MPP_OK;
    }

    return MPP_OK;
}